

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5TextureGatherOffset.cpp
# Opt level: O3

bool __thiscall
glcts::GPUShader5TextureGatherOffsetDepth2DClampToEdgeCaseTest::checkResult
          (GPUShader5TextureGatherOffsetDepth2DClampToEdgeCaseTest *this,
          CapturedVaryings *captured_data,uint index,uint texture_size)

{
  int iVar1;
  ostringstream *poVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  TestLog *pTVar6;
  ulong uVar7;
  long lVar8;
  TestError *this_00;
  ulong uVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  GLint expected_values [4];
  string local_208;
  string local_1e8;
  int local_1c8;
  int aiStack_1c4 [3];
  GLint *local_1b8;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  piVar5 = (this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).m_offsets_buffer_data.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  iVar3 = piVar5[index * 2];
  iVar4 = piVar5[(ulong)(index * 2) + 1];
  local_1b8 = captured_data->without_offset;
  lVar8 = 0;
  while (*(uint *)((long)captured_data->without_offset + lVar8) == texture_size) {
    lVar8 = lVar8 + 4;
    if (lVar8 == 0x10) {
      pTVar6 = ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
                super_GPUShader5TextureGatherOffsetDepthTestBase.
                super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
                super_TestNode.m_testCtx)->m_log;
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,"Unexpected sampling results","");
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,0x1af8059);
      tcu::LogSection::LogSection((LogSection *)local_1b0,&local_1e8,&local_208);
      tcu::TestLog::startSection(pTVar6,(char *)local_1b0._0_8_,local_190._M_p);
      tcu::LogSection::~LogSection((LogSection *)local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      GPUShader5TextureGatherOffsetTestBase::logCoordinates
                ((GPUShader5TextureGatherOffsetTestBase *)this,index);
      local_1b0._0_8_ =
           ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
            super_GPUShader5TextureGatherOffsetDepthTestBase.
            super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Texture size: ",0xe);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_138);
      local_1b0._0_8_ =
           ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
            super_GPUShader5TextureGatherOffsetDepthTestBase.
            super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Offsets: ",9);
      std::ostream::operator<<(poVar2,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
      std::ostream::operator<<(poVar2,iVar4);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_138);
      GPUShader5TextureGatherOffsetDepthTestBase::logVaryings
                ((GPUShader5TextureGatherOffsetDepthTestBase *)this,captured_data);
      tcu::TestLog::endSection
                (((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
                  super_GPUShader5TextureGatherOffsetDepthTestBase.
                  super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
                  super_TestNode.m_testCtx)->m_log);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unexpected sampling results",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5TextureGatherOffset.cpp"
                 ,0xb6f);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  iVar1 = texture_size - 1;
  aiStack_1c4[2] =
       captured_data->floor_tex_coord[0] * texture_size +
       ((*(int *)((long)captured_data->without_offset + lVar8) + iVar3) -
       *(int *)((long)GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::checkResult::
                      gather_offsets_x + lVar8));
  aiStack_1c4[0] = aiStack_1c4[2] + 1;
  aiStack_1c4[1] = aiStack_1c4[2] + 1;
  auVar14._0_4_ = -(uint)(aiStack_1c4[2] < 0);
  auVar14._4_4_ = -(uint)(aiStack_1c4[0] < 0);
  auVar14._8_4_ = -(uint)(aiStack_1c4[1] < 0);
  auVar14._12_4_ = -(uint)(aiStack_1c4[2] < 0);
  auVar11._0_4_ = -(uint)(iVar1 < aiStack_1c4[2]);
  auVar11._4_4_ = -(uint)(iVar1 < aiStack_1c4[0]);
  auVar11._8_4_ = -(uint)(iVar1 < aiStack_1c4[1]);
  auVar11._12_4_ = -(uint)(iVar1 < aiStack_1c4[2]);
  auVar12 = auVar11 | auVar14;
  auVar13._4_4_ = iVar1;
  auVar13._0_4_ = iVar1;
  auVar13._8_4_ = iVar1;
  auVar13._12_4_ = iVar1;
  auVar13 = ~auVar14 & auVar11 & auVar13;
  local_1c8 = aiStack_1c4[2];
  if ((auVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_1c8 = auVar13._0_4_;
  }
  if ((auVar12 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
    aiStack_1c4[0] = auVar13._4_4_;
  }
  if ((auVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    aiStack_1c4[1] = auVar13._8_4_;
  }
  if ((auVar12 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
    aiStack_1c4[2] = auVar13._12_4_;
  }
  if (captured_data->with_offset[0] == local_1c8) {
    uVar7 = 0;
    do {
      uVar9 = uVar7;
      if (uVar9 == 3) {
        return true;
      }
      uVar7 = uVar9 + 1;
    } while (captured_data->with_offset[uVar9 + 1] == aiStack_1c4[uVar9]);
    bVar10 = 2 < uVar9;
  }
  else {
    bVar10 = false;
  }
  pTVar6 = ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
            super_GPUShader5TextureGatherOffsetDepthTestBase.
            super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"Invalid result","");
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,0x1af8059);
  tcu::LogSection::LogSection((LogSection *)local_1b0,&local_1e8,&local_208);
  tcu::TestLog::startSection(pTVar6,(char *)local_1b0._0_8_,local_190._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  GPUShader5TextureGatherOffsetTestBase::logCoordinates
            ((GPUShader5TextureGatherOffsetTestBase *)this,index);
  local_1b0._0_8_ =
       ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
        super_GPUShader5TextureGatherOffsetDepthTestBase.super_GPUShader5TextureGatherOffsetTestBase
        .super_TestCaseBase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Texture size: ",0xe);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  local_1b0._0_8_ =
       ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
        super_GPUShader5TextureGatherOffsetDepthTestBase.super_GPUShader5TextureGatherOffsetTestBase
        .super_TestCaseBase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Offsets: ",9);
  std::ostream::operator<<(poVar2,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
  std::ostream::operator<<(poVar2,iVar4);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  GPUShader5TextureGatherOffsetTestBase::logArray
            ((GPUShader5TextureGatherOffsetTestBase *)this,local_1b8,4,"Without offset: ");
  GPUShader5TextureGatherOffsetTestBase::logArray
            ((GPUShader5TextureGatherOffsetTestBase *)this,captured_data->with_offset,4,
             "With offset: ");
  tcu::TestLog::endSection
            (((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
              super_GPUShader5TextureGatherOffsetDepthTestBase.
              super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log);
  return bVar10;
}

Assistant:

bool GPUShader5TextureGatherOffsetDepth2DClampToEdgeCaseTest::checkResult(const CapturedVaryings& captured_data,
																		  unsigned int index, unsigned int texture_size)
{
	/* Get offsets for vertex */
	glw::GLint x_offset;
	glw::GLint y_offset;

	getOffsets(x_offset, y_offset, index);

	/* Storage for expected values of with_offset varyings */
	glw::GLint expected_values[m_n_components_per_varying];

	/* Index of first not clamped texel in without_offset set*/
	int not_clamped_texel_index = -1;

	/* X offsets of texels in 2x2 set */
	static const glw::GLint gather_offsets_x[] = { 0, 1, 1, 0 };

	/* Find first not clamped texel in without_offset set */
	for (unsigned int i = 0; i < m_n_components_per_varying; ++i)
	{
		if ((int)texture_size != captured_data.without_offset[i])
		{
			not_clamped_texel_index = i;
			break;
		}
	}

	if (-1 == not_clamped_texel_index)
	{
		/* Log problem with sampler */
		m_testCtx.getLog() << tcu::TestLog::Section("Unexpected sampling results", "");

		logCoordinates(index);

		m_testCtx.getLog() << tcu::TestLog::Message << "Texture size: " << texture_size << tcu::TestLog::EndMessage;

		m_testCtx.getLog() << tcu::TestLog::Message << "Offsets: " << x_offset << ", " << y_offset
						   << tcu::TestLog::EndMessage;

		logVaryings(captured_data);

		m_testCtx.getLog() << tcu::TestLog::EndSection;

		TCU_FAIL("Unexpected sampling results");
	}

	/* Fraction part of position for lower left texel without_offset set */
	const glw::GLint fract_position_x =
		captured_data.without_offset[not_clamped_texel_index] - gather_offsets_x[not_clamped_texel_index];

	/* Absolute position of lower left corner in without_offset set */
	const glw::GLint absolute_position_x = fract_position_x + captured_data.floor_tex_coord[0] * (int)texture_size;

	/* Calculate expected values of with_offset varyings */
	for (unsigned int i = 0; i < m_n_components_per_varying; ++i)
	{
		expected_values[i] = absolute_position_x + gather_offsets_x[i];
		expected_values[i] += x_offset;

		/* Clamp when point is outside of texture */
		clamp(expected_values[i], 0, ((glw::GLint)texture_size) - 1);
	}

	/* Verify that expected_values match those in with_offset varyings */
	for (unsigned int i = 0; i < m_n_components_per_varying; ++i)
	{
		if (captured_data.with_offset[i] != expected_values[i])
		{
			/* Log invalid results */
			m_testCtx.getLog() << tcu::TestLog::Section("Invalid result", "");

			logCoordinates(index);

			m_testCtx.getLog() << tcu::TestLog::Message << "Texture size: " << texture_size << tcu::TestLog::EndMessage;

			m_testCtx.getLog() << tcu::TestLog::Message << "Offsets: " << x_offset << ", " << y_offset
							   << tcu::TestLog::EndMessage;

			logVaryings(captured_data);

			m_testCtx.getLog() << tcu::TestLog::EndSection;

			/* Done */
			return false;
		}
	}

	/* Done */
	return true;
}